

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto::InternalSwap(DescriptorProto *this,DescriptorProto *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  Rep *pRVar4;
  string *psVar5;
  MessageOptions *pMVar6;
  UnknownFieldSet *other_00;
  
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_002edeb9;
LAB_002edeac:
    other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_002edeac;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002edeb9:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pRVar4 = (this->field_).super_RepeatedPtrFieldBase.rep_;
  (this->field_).super_RepeatedPtrFieldBase.rep_ = (other->field_).super_RepeatedPtrFieldBase.rep_;
  (other->field_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  (this->field_).super_RepeatedPtrFieldBase.current_size_ =
       (other->field_).super_RepeatedPtrFieldBase.current_size_;
  (other->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->field_).super_RepeatedPtrFieldBase.total_size_;
  (this->field_).super_RepeatedPtrFieldBase.total_size_ =
       (other->field_).super_RepeatedPtrFieldBase.total_size_;
  (other->field_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
  (this->nested_type_).super_RepeatedPtrFieldBase.rep_ =
       (other->nested_type_).super_RepeatedPtrFieldBase.rep_;
  (other->nested_type_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ =
       (other->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  (other->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.total_size_;
  (this->nested_type_).super_RepeatedPtrFieldBase.total_size_ =
       (other->nested_type_).super_RepeatedPtrFieldBase.total_size_;
  (other->nested_type_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ =
       (other->enum_type_).super_RepeatedPtrFieldBase.rep_;
  (other->enum_type_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ =
       (other->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  (other->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ =
       (other->enum_type_).super_RepeatedPtrFieldBase.total_size_;
  (other->enum_type_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
  (this->extension_range_).super_RepeatedPtrFieldBase.rep_ =
       (other->extension_range_).super_RepeatedPtrFieldBase.rep_;
  (other->extension_range_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ =
       (other->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  (other->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.total_size_;
  (this->extension_range_).super_RepeatedPtrFieldBase.total_size_ =
       (other->extension_range_).super_RepeatedPtrFieldBase.total_size_;
  (other->extension_range_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ =
       (other->extension_).super_RepeatedPtrFieldBase.rep_;
  (other->extension_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ =
       (other->extension_).super_RepeatedPtrFieldBase.current_size_;
  (other->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ =
       (other->extension_).super_RepeatedPtrFieldBase.total_size_;
  (other->extension_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_ =
       (other->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
  (other->oneof_decl_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ =
       (other->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  (other->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ =
       (other->oneof_decl_).super_RepeatedPtrFieldBase.total_size_;
  (other->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
  (this->reserved_range_).super_RepeatedPtrFieldBase.rep_ =
       (other->reserved_range_).super_RepeatedPtrFieldBase.rep_;
  (other->reserved_range_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ =
       (other->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  (other->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ =
       (other->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
  (other->reserved_range_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.rep_ =
       (other->reserved_name_).super_RepeatedPtrFieldBase.rep_;
  (other->reserved_name_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ =
       (other->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  (other->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ =
       (other->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
  (other->reserved_name_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  psVar5 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar5;
  pMVar6 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar6;
  return;
}

Assistant:

void DescriptorProto::InternalSwap(DescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  field_.InternalSwap(&other->field_);
  nested_type_.InternalSwap(&other->nested_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  extension_range_.InternalSwap(&other->extension_range_);
  extension_.InternalSwap(&other->extension_);
  oneof_decl_.InternalSwap(&other->oneof_decl_);
  reserved_range_.InternalSwap(&other->reserved_range_);
  reserved_name_.InternalSwap(&other->reserved_name_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
}